

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

bool __thiscall
LowererMDArch::GenerateFastDivAndRem(LowererMDArch *this,Instr *instrDiv,LabelInstr *bailOutLabel)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  Opnd *this_00;
  Instr *pIVar5;
  RegOpnd *this_01;
  Opnd *src;
  Instr *imul;
  Opnd *reminderOpnd;
  bool success;
  Opnd *dst;
  Opnd *divisor;
  Opnd *divident;
  LabelInstr *bailOutLabel_local;
  Instr *instrDiv_local;
  LowererMDArch *this_local;
  
  if (instrDiv == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xc0f,"(instrDiv)","instrDiv");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  divisor = IR::Instr::GetSrc1(instrDiv);
  this_00 = IR::Instr::GetSrc2(instrDiv);
  pIVar5 = (Instr *)IR::Instr::GetDst(instrDiv);
  IVar3 = IR::Opnd::GetType(divisor);
  if ((IVar3 == TyInt32) || (IVar3 = IR::Opnd::GetType(divisor), IVar3 == TyUint32)) {
    bVar2 = IR::Opnd::IsRegOpnd(divisor);
    if (bVar2) {
      this_01 = IR::Opnd::AsRegOpnd(divisor);
      bVar2 = IR::RegOpnd::IsSameRegUntyped(this_01,(Opnd *)pIVar5);
      if ((bVar2) &&
         (((instrDiv->m_opcode == Rem_I4 || (instrDiv->m_opcode == RemU_I4)) ||
          (bailOutLabel != (LabelInstr *)0x0)))) {
        divisor = &IR::RegOpnd::New(TyInt32,instrDiv->m_func)->super_Opnd;
        src = IR::Instr::GetSrc1(instrDiv);
        Lowerer::InsertMove(divisor,src,instrDiv,true);
      }
    }
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,BitopsFastPathPhase,sourceContextId,functionId);
    if ((bVar2) || (bVar2 = IR::Opnd::IsIntConstOpnd(this_00), !bVar2)) {
      this_local._7_1_ = false;
    }
    else {
      reminderOpnd._7_1_ = false;
      if ((instrDiv->m_opcode == DivU_I4) || (instrDiv->m_opcode == RemU_I4)) {
        reminderOpnd._7_1_ = GenerateFastDivAndRem_Unsigned(this,instrDiv);
      }
      else if ((instrDiv->m_opcode == Div_I4) || (instrDiv->m_opcode == Rem_I4)) {
        reminderOpnd._7_1_ = GenerateFastDivAndRem_Signed(this,instrDiv);
      }
      if (reminderOpnd._7_1_ == false) {
        this_local._7_1_ = false;
      }
      else {
        if (((instrDiv->m_opcode == Rem_I4) || (instrDiv->m_opcode == RemU_I4)) ||
           (bailOutLabel != (LabelInstr *)0x0)) {
          imul = pIVar5;
          if (bailOutLabel != (LabelInstr *)0x0) {
            imul = (Instr *)IR::RegOpnd::New(TyInt32,instrDiv->m_func);
          }
          pIVar5 = IR::Instr::New(IMUL2,(Opnd *)imul,(Opnd *)pIVar5,this_00,instrDiv->m_func);
          IR::Instr::InsertBefore(instrDiv,pIVar5);
          LowererMD::Legalize<false>(pIVar5,false);
          Lowerer::InsertSub(false,(Opnd *)imul,divisor,(Opnd *)imul,instrDiv);
          if (bailOutLabel != (LabelInstr *)0x0) {
            Lowerer::InsertTestBranch((Opnd *)imul,(Opnd *)imul,BrNeq_A,bailOutLabel,instrDiv);
          }
        }
        IR::Instr::Remove(instrDiv);
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LowererMDArch::GenerateFastDivAndRem(IR::Instr* instrDiv, IR::LabelInstr* bailOutLabel)
{
    Assert(instrDiv);
    IR::Opnd* divident  = instrDiv->GetSrc1(); // nominator
    IR::Opnd* divisor   = instrDiv->GetSrc2(); // denominator
    IR::Opnd* dst       = instrDiv->GetDst();

    if (divident->GetType() != TyInt32 && divident->GetType() != TyUint32)
    {
        return false;
    }

    if (divident->IsRegOpnd() && divident->AsRegOpnd()->IsSameRegUntyped(dst))
    {
        if (instrDiv->m_opcode == Js::OpCode::Rem_I4 || instrDiv->m_opcode == Js::OpCode::RemU_I4 || bailOutLabel)
        {
            divident = IR::RegOpnd::New(TyInt32, instrDiv->m_func);
            Lowerer::InsertMove(divident, instrDiv->GetSrc1(), instrDiv);
        }
    }

    if (PHASE_OFF(Js::BitopsFastPathPhase, this->m_func) || !divisor->IsIntConstOpnd())
    {
        return false;
    }

    bool success = false;
    if (instrDiv->m_opcode == Js::OpCode::DivU_I4 || instrDiv->m_opcode == Js::OpCode::RemU_I4)
    {
        success = GenerateFastDivAndRem_Unsigned(instrDiv);
    }
    else if (instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4)
    {
        success = GenerateFastDivAndRem_Signed(instrDiv);
    }

    if (!success)
    {
        return false;
    }
    // For reminder/mod ops
    if (instrDiv->m_opcode == Js::OpCode::Rem_I4 || instrDiv->m_opcode == Js::OpCode::RemU_I4 || bailOutLabel)
    {
        // For q = n/d
        // mul dst, dst, divident
        // sub dst, divident, dst
        IR::Opnd* reminderOpnd = dst;;
        if (bailOutLabel)
        {
            reminderOpnd = IR::RegOpnd::New(TyInt32, instrDiv->m_func);
        }

        IR::Instr* imul = IR::Instr::New(LowererMD::MDImulOpcode, reminderOpnd, dst, divisor, instrDiv->m_func);
        instrDiv->InsertBefore(imul);
        LowererMD::Legalize(imul);
        Lowerer::InsertSub(false, reminderOpnd, divident, reminderOpnd, instrDiv);
        if (bailOutLabel)
        {
            Lowerer::InsertTestBranch(reminderOpnd, reminderOpnd, Js::OpCode::BrNeq_A, bailOutLabel, instrDiv);
        }
    }

    // DIV/REM has been optimized and can be removed now.
    instrDiv->Remove();
    return true;
}